

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O3

QVariant * __thiscall
QMYSQLResult::data(QVariant *__return_storage_ptr__,QMYSQLResult *this,int field)

{
  int *piVar1;
  double dVar2;
  bool bVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  undefined8 uVar6;
  char cVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ulonglong uVar12;
  longlong lVar13;
  undefined8 *puVar14;
  ulong uVar15;
  undefined4 uVar16;
  ulong uVar17;
  char *pcVar18;
  QMetaTypeInterface *pQVar19;
  long lVar20;
  long *plVar21;
  undefined8 uVar22;
  anon_union_24_3_e3d07ef4_for_data *this_00;
  long in_FS_OFFSET;
  QStringView QVar23;
  QStringView QVar24;
  QStringView QVar25;
  QStringView QVar26;
  bool ok;
  qsizetype local_c8;
  QString local_b8;
  anon_union_24_3_e3d07ef4_for_data local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar11 = *(long *)&this->field_0x8;
  cVar7 = QSqlResult::isSelect();
  if ((cVar7 == '\0') || (lVar20 = (long)field, *(long *)(lVar11 + 0xd0) <= lVar20)) {
    lcMysql();
    if (((byte)lcMysql::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      data((QMYSQLResult *)(ulong)(uint)field);
    }
LAB_0010a092:
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  }
  else {
    lVar10 = QSqlResult::driver();
    if (lVar10 == 0) goto LAB_0010a092;
    plVar21 = (long *)(lVar20 * 0x28 + *(long *)(lVar11 + 200));
    local_b8.d.d = (Data *)0x0;
    local_b8.d.ptr = (char16_t *)0x0;
    local_b8.d.size = 0;
    if (*(char *)(lVar11 + 0xfd) == '\x01') {
      if ((char)plVar21[3] == '\x01') goto LAB_0010a120;
      uVar8 = *(uint *)(plVar21[1] + 0x70);
      if (uVar8 == 0x10) {
        local_58.shared = (PrivateShared *)(QArrayData *)0x0;
        if ((*plVar21 != 0) && (uVar15 = *(long *)(plVar21[1] + 0x38) + 7, 7 < uVar15)) {
          local_58.shared = (PrivateShared *)(QArrayData *)0x0;
          uVar17 = 0;
          do {
            local_58.shared =
                 (PrivateShared *)((long)local_58.shared << 8 | (ulong)*(byte *)(*plVar21 + uVar17))
            ;
            uVar17 = uVar17 + 1;
          } while (uVar15 >> 3 != uVar17);
        }
        QVariant::fromValue<unsigned_long,_true>
                  (__return_storage_ptr__,(unsigned_long *)local_58.data);
        goto LAB_0010a765;
      }
      pQVar19 = (QMetaTypeInterface *)plVar21[2];
      if (pQVar19 == (QMetaTypeInterface *)0x0) {
LAB_0010a325:
        if ((uVar8 < 0xd) && ((0x1480U >> (uVar8 & 0x1f) & 1) != 0)) {
          pQVar19 = (QMetaTypeInterface *)plVar21[2];
          if (0x27 < (ulong)plVar21[4]) {
            piVar1 = (int *)*plVar21;
            if (pQVar19 == (QMetaTypeInterface *)0x0) {
LAB_0010a371:
              QDate::QDate((QDate *)&local_58.shared,*piVar1,piVar1[1],piVar1[2]);
              uVar22 = local_58.shared;
            }
            else {
              iVar9 = (pQVar19->typeId)._q_value.super___atomic_base<int>._M_i;
              if (iVar9 == 0) {
                iVar9 = QMetaType::registerHelper(pQVar19);
              }
              if (iVar9 != 0xf) goto LAB_0010a371;
              uVar22 = -0x8000000000000000;
            }
            pQVar19 = (QMetaTypeInterface *)plVar21[2];
            if (pQVar19 == (QMetaTypeInterface *)0x0) {
LAB_0010a3ab:
              QTime::QTime((QTime *)&local_58,piVar1[3],piVar1[4],piVar1[5],
                           (int)(*(ulong *)(piVar1 + 6) / 1000));
              uVar16 = local_58._0_4_;
            }
            else {
              iVar9 = (pQVar19->typeId)._q_value.super___atomic_base<int>._M_i;
              if (iVar9 == 0) {
                iVar9 = QMetaType::registerHelper(pQVar19);
              }
              uVar16 = -1;
              if (iVar9 != 0xe) goto LAB_0010a3ab;
            }
            pQVar19 = (QMetaTypeInterface *)plVar21[2];
            if (pQVar19 != (QMetaTypeInterface *)0x0) {
              iVar9 = (pQVar19->typeId)._q_value.super___atomic_base<int>._M_i;
              if (iVar9 == 0) {
                iVar9 = QMetaType::registerHelper(pQVar19);
              }
              if (iVar9 == 0x10) {
                local_78._forAlignment = 9.88131291682493e-324;
                QDateTime::QDateTime((QDateTime *)&local_58,uVar22,uVar16,&local_78,1);
                QVariant::QVariant(__return_storage_ptr__,(QDateTime *)local_58.data);
                QDateTime::~QDateTime((QDateTime *)local_58.data);
                QTimeZone::~QTimeZone((QTimeZone *)&local_78.shared);
                goto LAB_0010a765;
              }
              pQVar19 = (QMetaTypeInterface *)plVar21[2];
              if (pQVar19 != (QMetaTypeInterface *)0x0) {
                iVar9 = (pQVar19->typeId)._q_value.super___atomic_base<int>._M_i;
                if (iVar9 == 0) {
                  iVar9 = QMetaType::registerHelper(pQVar19);
                }
                if (iVar9 == 0xe) {
                  QVariant::QVariant(__return_storage_ptr__,(QDate)uVar22);
                  goto LAB_0010a765;
                }
              }
            }
            QVariant::QVariant(__return_storage_ptr__,(QTime)uVar16);
            goto LAB_0010a765;
          }
        }
        else {
          pQVar19 = (QMetaTypeInterface *)plVar21[2];
        }
        if (pQVar19 == (QMetaTypeInterface *)0x0) {
LAB_0010a46c:
          QString::fromUtf8((QString *)&local_58,(char *)*plVar21,plVar21[4]);
          uVar6 = local_58._16_8_;
          uVar22 = local_58.shared;
          pcVar5 = local_b8.d.ptr;
          pDVar4 = local_b8.d.d;
          local_58.shared = (PrivateShared *)local_b8.d.d;
          local_b8.d.d = (Data *)uVar22;
          local_b8.d.ptr = (char16_t *)local_58._8_8_;
          local_58._8_8_ = pcVar5;
          local_58._16_8_ = local_b8.d.size;
          local_b8.d.size = uVar6;
          if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
            }
          }
        }
        else {
          iVar9 = (pQVar19->typeId)._q_value.super___atomic_base<int>._M_i;
          if (iVar9 == 0) {
            iVar9 = QMetaType::registerHelper(pQVar19);
          }
          if (iVar9 != 0xc) goto LAB_0010a46c;
        }
        local_c8 = 0;
        goto LAB_0010a4cb;
      }
      uVar8 = (pQVar19->typeId)._q_value.super___atomic_base<int>._M_i;
      if (uVar8 == 0) {
        uVar8 = QMetaType::registerHelper(pQVar19);
      }
      if ((0x25 < uVar8) || ((0x360000003cU >> ((ulong)uVar8 & 0x3f) & 1) == 0)) {
        uVar8 = *(uint *)(plVar21[1] + 0x70);
        goto LAB_0010a325;
      }
      local_58._16_8_ = -0x5555555555555556;
      uStack_40 = 0xaaaaaaaaaaaaaaaa;
      local_58.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
      local_58._8_8_ = (QString *)0xaaaaaaaaaaaaaaaa;
      QVariant::QVariant((QVariant *)&local_58,(QMetaTypeInterface *)plVar21[2],(void *)*plVar21);
      pQVar19 = (QMetaTypeInterface *)plVar21[2];
      if (pQVar19 == (QMetaTypeInterface *)0x0) {
LAB_0010a2db:
        *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = local_58._16_8_;
        *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = uStack_40;
        (__return_storage_ptr__->d).data.shared = local_58.shared;
        *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = local_58._8_8_;
        local_58.shared = (PrivateShared *)0x0;
        local_58._8_8_ = (QString *)0x0;
        local_58._16_8_ = 0;
        uStack_40 = 2;
      }
      else {
        iVar9 = (pQVar19->typeId)._q_value.super___atomic_base<int>._M_i;
        if (iVar9 == 0) {
          iVar9 = QMetaType::registerHelper(pQVar19);
        }
        if (iVar9 != 0x25) {
          pQVar19 = (QMetaTypeInterface *)plVar21[2];
          if (pQVar19 != (QMetaTypeInterface *)0x0) {
            iVar9 = (pQVar19->typeId)._q_value.super___atomic_base<int>._M_i;
            if (iVar9 == 0) {
              iVar9 = QMetaType::registerHelper(pQVar19);
            }
            if (iVar9 == 0x22) {
              iVar9 = QVariant::toInt((bool *)local_58.data);
              QVariant::QVariant(__return_storage_ptr__,iVar9);
              goto LAB_0010a30f;
            }
          }
          goto LAB_0010a2db;
        }
        uVar8 = QVariant::toUInt((bool *)local_58.data);
        QVariant::QVariant(__return_storage_ptr__,uVar8);
      }
LAB_0010a30f:
      QVariant::~QVariant((QVariant *)&local_58);
    }
    else {
      lVar10 = *(long *)(*(long *)(lVar11 + 0xb8) + lVar20 * 8);
      if (lVar10 == 0) {
LAB_0010a120:
        QVariant::QVariant(__return_storage_ptr__,(QMetaTypeInterface *)plVar21[2],(void *)0x0);
      }
      else if (*(int *)(plVar21[1] + 0x70) == 0x10) {
        uVar15 = *(long *)(plVar21[1] + 0x38) + 7;
        if (uVar15 < 8) {
          local_58.shared = (PrivateShared *)(QArrayData *)0x0;
        }
        else {
          local_58.shared = (PrivateShared *)(QArrayData *)0x0;
          uVar17 = 0;
          do {
            local_58.shared =
                 (PrivateShared *)((long)local_58.shared << 8 | (ulong)*(byte *)(lVar10 + uVar17));
            uVar17 = uVar17 + 1;
          } while (uVar15 >> 3 != uVar17);
        }
        if (_DAT_0011a254 == 0) {
          QMetaType::registerHelper
                    ((QMetaTypeInterface *)
                     &QtPrivate::QMetaTypeInterfaceWrapper<unsigned_long>::metaType);
        }
        QVariant::moveConstruct
                  ((QMetaType)__return_storage_ptr__,
                   &QtPrivate::QMetaTypeInterfaceWrapper<unsigned_long>::metaType);
      }
      else {
        lVar10 = mysql_fetch_lengths(*(undefined8 *)(lVar11 + 0xb0));
        local_c8 = *(qsizetype *)(lVar10 + lVar20 * 8);
        pQVar19 = (QMetaTypeInterface *)plVar21[2];
        if (pQVar19 != (QMetaTypeInterface *)0x0) {
          iVar9 = (pQVar19->typeId)._q_value.super___atomic_base<int>._M_i;
          if (iVar9 == 0) {
            iVar9 = QMetaType::registerHelper(pQVar19);
          }
          if (iVar9 == 0xc) goto LAB_0010a4cb;
        }
        QString::fromUtf8((QString *)&local_58,*(char **)(*(long *)(lVar11 + 0xb8) + lVar20 * 8),
                          local_c8);
        uVar6 = local_58._16_8_;
        uVar22 = local_58.shared;
        pcVar5 = local_b8.d.ptr;
        pDVar4 = local_b8.d.d;
        local_58.shared = (PrivateShared *)local_b8.d.d;
        local_b8.d.d = (Data *)uVar22;
        local_b8.d.ptr = (char16_t *)local_58._8_8_;
        local_58._8_8_ = pcVar5;
        local_58._16_8_ = local_b8.d.size;
        local_b8.d.size = uVar6;
        if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
          }
        }
LAB_0010a4cb:
        pQVar19 = (QMetaTypeInterface *)plVar21[2];
        if (pQVar19 == (QMetaTypeInterface *)0x0) {
switchD_0010a4fa_caseD_7:
          QVariant::QVariant(__return_storage_ptr__,&local_b8);
        }
        else {
          iVar9 = (pQVar19->typeId)._q_value.super___atomic_base<int>._M_i;
          if (iVar9 == 0) {
            iVar9 = QMetaType::registerHelper(pQVar19);
          }
          switch(iVar9) {
          case 3:
switchD_0010a4fa_caseD_3:
            QVar24.m_data = local_b8.d.ptr;
            QVar24.m_size = local_b8.d.size;
            uVar17 = QString::toIntegral_helper(QVar24,(bool *)0x0,10);
            uVar15 = 0;
            if (uVar17 < 0x100000000) {
              uVar15 = uVar17;
            }
            QVariant::QVariant(__return_storage_ptr__,(uint)uVar15);
            break;
          case 4:
            QVar23.m_data = local_b8.d.ptr;
            QVar23.m_size = local_b8.d.size;
            lVar13 = QString::toIntegral_helper(QVar23,(bool *)0x0,10);
            QVariant::QVariant(__return_storage_ptr__,lVar13);
            break;
          case 5:
            QVar26.m_data = local_b8.d.ptr;
            QVar26.m_size = local_b8.d.size;
            uVar12 = QString::toIntegral_helper(QVar26,(bool *)0x0,10);
            QVariant::QVariant(__return_storage_ptr__,uVar12);
            break;
          case 6:
            local_58.shared = (PrivateShared *)0x0;
            local_58._8_8_ = (QString *)0x0;
            local_58._16_8_ = 0;
            uStack_40 = 2;
            bVar3 = false;
            dVar2 = (double)QString::toDouble((bool *)&local_b8);
            iVar9 = QSqlResult::numericalPrecisionPolicy();
            if (iVar9 == 4) {
              this_00 = &local_78;
              QVariant::QVariant((QVariant *)this_00,dVar2);
              QVariant::operator=((QVariant *)&local_58,(QVariant *)this_00);
LAB_0010a7f7:
              QVariant::~QVariant((QVariant *)this_00);
            }
            else {
              if (iVar9 == 2) {
                QVariant::QVariant((QVariant *)&local_98,dVar2);
                lVar13 = QVariant::toLongLong((bool *)local_98.data);
                QVariant::QVariant((QVariant *)&local_78,lVar13);
LAB_0010a7c1:
                this_00 = &local_98;
                QVariant::operator=((QVariant *)&local_58,(QVariant *)&local_78);
                QVariant::~QVariant((QVariant *)&local_78);
                goto LAB_0010a7f7;
              }
              if (iVar9 == 1) {
                QVariant::QVariant((QVariant *)&local_98,dVar2);
                iVar9 = QVariant::toInt((bool *)local_98.data);
                QVariant::QVariant((QVariant *)&local_78,iVar9);
                goto LAB_0010a7c1;
              }
              QVariant::QVariant((QVariant *)&local_78,&local_b8);
              QVariant::operator=((QVariant *)&local_58,(QVariant *)&local_78);
              QVariant::~QVariant((QVariant *)&local_78);
              bVar3 = true;
            }
            if (bVar3) {
              puVar14 = &uStack_40;
              *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = local_58._16_8_;
              *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = uStack_40;
              (__return_storage_ptr__->d).data.shared = local_58.shared;
              *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = local_58._8_8_;
              local_58.shared = (PrivateShared *)0x0;
              local_58._8_8_ = (QString *)0x0;
              local_58._16_8_ = 0;
            }
            else {
              (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
              *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
              *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
              puVar14 = (undefined8 *)&(__return_storage_ptr__->d).field_0x18;
            }
            *puVar14 = 2;
            goto LAB_0010a30f;
          case 7:
          case 8:
          case 9:
          case 10:
          case 0xb:
          case 0xd:
            goto switchD_0010a4fa_caseD_7;
          case 0xc:
            local_58.shared = (PrivateShared *)0x0;
            local_58._8_8_ = 0;
            local_58._16_8_ = 0;
            if (*(char *)(lVar11 + 0xfd) == '\x01') {
              pcVar18 = (char *)*plVar21;
              local_c8 = plVar21[4];
            }
            else {
              pcVar18 = *(char **)(*(long *)(lVar11 + 0xb8) + lVar20 * 8);
            }
            QByteArray::QByteArray((QByteArray *)&local_78,pcVar18,local_c8);
            local_58.shared = local_78.shared;
            local_58._8_8_ = local_78._8_8_;
            local_58._16_8_ = local_78._16_8_;
            QVariant::QVariant(__return_storage_ptr__,(QByteArray *)&local_58);
            if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
              LOCK();
              *(int *)local_58.shared = *(int *)local_58.shared + -1;
              UNLOCK();
              if (*(int *)local_58.shared == 0) {
                QArrayData::deallocate((QArrayData *)local_58.shared,1,0x10);
              }
            }
            break;
          case 0xe:
            qDateFromString(__return_storage_ptr__,(QString *)local_b8.d.ptr);
            break;
          case 0xf:
            qTimeFromString(__return_storage_ptr__,(QString *)local_b8.d.ptr);
            break;
          case 0x10:
            qDateTimeFromString(__return_storage_ptr__,&local_b8);
            break;
          default:
            if (1 < iVar9 - 0x21U) {
              if (1 < iVar9 - 0x24U) goto switchD_0010a4fa_caseD_7;
              goto switchD_0010a4fa_caseD_3;
            }
          case 2:
            QVar25.m_data = local_b8.d.ptr;
            QVar25.m_size = local_b8.d.size;
            lVar11 = QString::toIntegral_helper(QVar25,(bool *)0x0,10);
            iVar9 = (int)lVar11;
            if ((int)lVar11 != lVar11) {
              iVar9 = 0;
            }
            QVariant::QVariant(__return_storage_ptr__,iVar9);
          }
        }
      }
    }
LAB_0010a765:
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant QMYSQLResult::data(int field)
{
    Q_D(QMYSQLResult);
    if (!isSelect() || field >= d->fields.size()) {
        qCWarning(lcMysql, "QMYSQLResult::data: column %d out of range", field);
        return QVariant();
    }

    if (!driver())
        return QVariant();

    my_ulonglong fieldLength = 0;
    const QMYSQLResultPrivate::QMyField &f = d->fields.at(field);
    QString val;
    if (d->preparedQuery) {
        if (f.nullIndicator)
            return QVariant(f.type);
        if (qIsBitfield(f.myField->type)) {
            return QVariant::fromValue(qDecodeBitfield(f, f.outField));
        } else if (qIsInteger(f.type.id())) {
            QVariant variant(f.type, f.outField);
            // we never want to return char variants here, see QTBUG-53397
            if (f.type.id() == QMetaType::UChar)
                return variant.toUInt();
            else if (f.type.id() == QMetaType::Char)
                return variant.toInt();
            return variant;
        } else if (qIsTimeOrDate(f.myField->type) && f.bufLength >= sizeof(QT_MYSQL_TIME)) {
            auto t = reinterpret_cast<const QT_MYSQL_TIME *>(f.outField);
            QDate date;
            QTime time;
            if (f.type.id() != QMetaType::QTime)
                date = QDate(t->year, t->month, t->day);
            if (f.type.id() != QMetaType::QDate)
                time = QTime(t->hour, t->minute, t->second, t->second_part / 1000);
            if (f.type.id() == QMetaType::QDateTime)
                return QDateTime(date, time, QTimeZone::UTC);
            else if (f.type.id() == QMetaType::QDate)
                return date;
            else
                return time;
        }

        if (f.type.id() != QMetaType::QByteArray)
            val = QString::fromUtf8(f.outField, f.bufLength);
    } else {
        if (d->row[field] == nullptr) {
            // NULL value
            return QVariant(f.type);
        }

        if (qIsBitfield(f.myField->type))
            return QVariant::fromValue(qDecodeBitfield(f, d->row[field]));

        fieldLength = mysql_fetch_lengths(d->result)[field];

        if (f.type.id() != QMetaType::QByteArray)
            val = QString::fromUtf8(d->row[field], fieldLength);
    }

    switch (f.type.id()) {
    case QMetaType::LongLong:
        return QVariant(val.toLongLong());
    case QMetaType::ULongLong:
        return QVariant(val.toULongLong());
    case QMetaType::Char:
    case QMetaType::Short:
    case QMetaType::Int:
        return QVariant(val.toInt());
    case QMetaType::UChar:
    case QMetaType::UShort:
    case QMetaType::UInt:
        return QVariant(val.toUInt());
    case QMetaType::Double: {
        QVariant v;
        bool ok=false;
        double dbl = val.toDouble(&ok);
        switch(numericalPrecisionPolicy()) {
            case QSql::LowPrecisionInt32:
                v=QVariant(dbl).toInt();
                break;
            case QSql::LowPrecisionInt64:
                v = QVariant(dbl).toLongLong();
                break;
            case QSql::LowPrecisionDouble:
                v = QVariant(dbl);
                break;
            case QSql::HighPrecision:
            default:
                v = val;
                ok = true;
                break;
        }
        if (ok)
            return v;
        return QVariant();
    }
    case QMetaType::QDate:
        return qDateFromString(val);
    case QMetaType::QTime:
        return qTimeFromString(val);
    case QMetaType::QDateTime:
        return qDateTimeFromString(val);
    case QMetaType::QByteArray: {

        QByteArray ba;
        if (d->preparedQuery) {
            ba = QByteArray(f.outField, f.bufLength);
        } else {
            ba = QByteArray(d->row[field], fieldLength);
        }
        return QVariant(ba);
    }
    case QMetaType::QString:
    default:
        return QVariant(val);
    }
    Q_UNREACHABLE();
}